

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O2

void __thiscall
IRT::CExpressionList::CExpressionList
          (CExpressionList *this,
          unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
          *_expression)

{
  pointer *__ptr;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_18;
  
  (this->super_IExpression).super_INode._vptr_INode = (_func_int **)&PTR_Accept_0017b350;
  (this->expressions).
  super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->expressions).
  super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expressions).
  super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18._M_head_impl =
       (_expression->_M_t).
       super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
       .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (_expression->_M_t).
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  std::
  vector<std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>,std::allocator<std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>>>
  ::
  emplace_back<std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>>
            ((vector<std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>,std::allocator<std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>>>
              *)&this->expressions,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_18);
  if (local_18._M_head_impl != (CExpression *)0x0) {
    (*((local_18._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  return;
}

Assistant:

IRT::CExpressionList::CExpressionList( std::unique_ptr<const IRT::CExpression> _expression ) {
    Add( std::move( _expression ));
}